

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  uchar filterType;
  uchar *puVar1;
  uint uVar2;
  ulong length;
  ulong bytewidth_00;
  long lVar3;
  float local_708;
  float local_6fc;
  uint local_6f8;
  undefined1 local_6f0 [4];
  uint testsize;
  LodePNGCompressSettings zlibsettings;
  uchar *dummy;
  uint bestType_2;
  uint type_3;
  size_t smallest_2;
  ucvector attempt_2 [5];
  size_t size [5];
  uchar type_2;
  size_t inindex_1;
  size_t outindex_1;
  uint uStack_5d8;
  float p;
  uint count [256];
  uint local_1d0;
  uint bestType_1;
  uint type_1;
  float smallest_1;
  ucvector attempt_1 [5];
  float sum_1 [5];
  uchar s;
  uchar bestType;
  uchar type;
  size_t smallest;
  ucvector attempt [5];
  size_t sum [5];
  size_t inindex;
  size_t outindex;
  LodePNGFilterStrategy strategy;
  uint error;
  uint y;
  uint x;
  uchar *prevline;
  size_t bytewidth;
  size_t linebytes;
  uint bpp;
  LodePNGEncoderSettings *settings_local;
  LodePNGColorMode *info_local;
  uint h_local;
  uint w_local;
  uchar *in_local;
  uchar *out_local;
  
  uVar2 = lodepng_get_bpp(info);
  length = (ulong)(w * uVar2 + 7 >> 3);
  bytewidth_00 = (ulong)(uVar2 + 7 >> 3);
  _y = (uchar *)0x0;
  outindex._0_4_ = settings->filter_strategy;
  if ((settings->filter_palette_zero != 0) &&
     ((info->colortype == LCT_PALETTE || (info->bitdepth < 8)))) {
    outindex._0_4_ = LFS_ZERO;
  }
  if (uVar2 == 0) {
    out_local._4_4_ = 0x1f;
  }
  else {
    if ((LodePNGFilterStrategy)outindex == LFS_ZERO) {
      for (strategy = LFS_ZERO; strategy < h; strategy = strategy + LFS_MINSUM) {
        lVar3 = (length + 1) * (ulong)strategy;
        out[lVar3] = '\0';
        filterScanline(out + lVar3 + 1,in + length * strategy,_y,length,bytewidth_00,'\0');
        _y = in + length * strategy;
      }
    }
    else if ((LodePNGFilterStrategy)outindex == LFS_MINSUM) {
      stack0xfffffffffffffed0 = 0;
      sum_1[3]._2_1_ = 0;
      for (sum_1[3]._3_1_ = 0; sum_1[3]._3_1_ < 5; sum_1[3]._3_1_ = sum_1[3]._3_1_ + 1) {
        ucvector_init((ucvector *)&attempt[(ulong)sum_1[3]._3_1_ - 1].allocsize);
        uVar2 = ucvector_resize((ucvector *)&attempt[(ulong)sum_1[3]._3_1_ - 1].allocsize,length);
        if (uVar2 == 0) {
          return 0x53;
        }
      }
      for (strategy = LFS_ZERO; strategy < h; strategy = strategy + LFS_MINSUM) {
        for (sum_1[3]._3_1_ = 0; sum_1[3]._3_1_ < 5; sum_1[3]._3_1_ = sum_1[3]._3_1_ + 1) {
          filterScanline((uchar *)attempt[(ulong)sum_1[3]._3_1_ - 1].allocsize,
                         in + strategy * length,_y,length,bytewidth_00,sum_1[3]._3_1_);
          sum[(ulong)sum_1[3]._3_1_ - 1] = 0;
          if (sum_1[3]._3_1_ == 0) {
            for (error = 0; error < length; error = error + 1) {
            }
          }
          else {
            for (error = 0; error < length; error = error + 1) {
              sum_1[3]._1_1_ =
                   *(byte *)(attempt[(ulong)sum_1[3]._3_1_ - 1].allocsize + (ulong)error);
              if (sum_1[3]._1_1_ < 0x80) {
                local_6f8 = (uint)sum_1[3]._1_1_;
              }
              else {
                local_6f8 = 0xff - sum_1[3]._1_1_;
              }
              sum[(ulong)sum_1[3]._3_1_ - 1] = (ulong)local_6f8 + sum[(ulong)sum_1[3]._3_1_ - 1];
            }
          }
          if ((sum_1[3]._3_1_ == 0) || (sum[(ulong)sum_1[3]._3_1_ - 1] < stack0xfffffffffffffed0)) {
            sum_1[3]._2_1_ = sum_1[3]._3_1_;
            stack0xfffffffffffffed0 = sum[(ulong)sum_1[3]._3_1_ - 1];
          }
        }
        _y = in + strategy * length;
        out[(ulong)strategy * (length + 1)] = sum_1[3]._2_1_;
        for (error = 0; error < length; error = error + 1) {
          out[(ulong)strategy * (length + 1) + 1 + (ulong)error] =
               *(uchar *)(attempt[(ulong)sum_1[3]._2_1_ - 1].allocsize + (ulong)error);
        }
      }
      for (sum_1[3]._3_1_ = 0; sum_1[3]._3_1_ < 5; sum_1[3]._3_1_ = sum_1[3]._3_1_ + 1) {
        ucvector_cleanup(&attempt[(ulong)sum_1[3]._3_1_ - 1].allocsize);
      }
    }
    else if ((LodePNGFilterStrategy)outindex == LFS_ENTROPY) {
      bestType_1 = 0;
      count[0xff] = 0;
      for (local_1d0 = 0; local_1d0 < 5; local_1d0 = local_1d0 + 1) {
        ucvector_init((ucvector *)(&type_1 + (ulong)local_1d0 * 6));
        uVar2 = ucvector_resize((ucvector *)(&type_1 + (ulong)local_1d0 * 6),length);
        if (uVar2 == 0) {
          return 0x53;
        }
      }
      for (strategy = LFS_ZERO; strategy < h; strategy = strategy + LFS_MINSUM) {
        for (local_1d0 = 0; local_1d0 < 5; local_1d0 = local_1d0 + 1) {
          filterScanline(*(uchar **)(&type_1 + (ulong)local_1d0 * 6),in + strategy * length,_y,
                         length,bytewidth_00,(uchar)local_1d0);
          for (error = 0; error < 0x100; error = error + 1) {
            (&uStack_5d8)[error] = 0;
          }
          for (error = 0; error < length; error = error + 1) {
            (&uStack_5d8)[*(byte *)(*(long *)(&type_1 + (ulong)local_1d0 * 6) + (ulong)error)] =
                 (&uStack_5d8)[*(byte *)(*(long *)(&type_1 + (ulong)local_1d0 * 6) + (ulong)error)]
                 + 1;
          }
          (&uStack_5d8)[local_1d0] = (&uStack_5d8)[local_1d0] + 1;
          sum_1[(ulong)local_1d0 - 2] = 0.0;
          for (error = 0; error < 0x100; error = error + 1) {
            uVar2 = (&uStack_5d8)[error];
            local_6fc = (float)(length + 1);
            if ((&uStack_5d8)[error] == 0) {
              local_708 = 0.0;
            }
            else {
              local_708 = flog2(1.0 / ((float)uVar2 / local_6fc));
              local_708 = local_708 * ((float)uVar2 / local_6fc);
            }
            sum_1[(ulong)local_1d0 - 2] = local_708 + sum_1[(ulong)local_1d0 - 2];
          }
          if ((local_1d0 == 0) || (sum_1[(ulong)local_1d0 - 2] < (float)bestType_1)) {
            count[0xff] = local_1d0;
            bestType_1 = (uint)sum_1[(ulong)local_1d0 - 2];
          }
        }
        _y = in + strategy * length;
        out[(ulong)strategy * (length + 1)] = (uchar)count[0xff];
        for (error = 0; error < length; error = error + 1) {
          out[(ulong)strategy * (length + 1) + 1 + (ulong)error] =
               *(uchar *)(*(long *)(&type_1 + (ulong)count[0xff] * 6) + (ulong)error);
        }
      }
      for (local_1d0 = 0; local_1d0 < 5; local_1d0 = local_1d0 + 1) {
        ucvector_cleanup(&type_1 + (ulong)local_1d0 * 6);
      }
    }
    else if ((LodePNGFilterStrategy)outindex == LFS_PREDEFINED) {
      for (strategy = LFS_ZERO; strategy < h; strategy = strategy + LFS_MINSUM) {
        lVar3 = (length + 1) * (ulong)strategy;
        filterType = settings->predefined_filters[strategy];
        out[lVar3] = filterType;
        filterScanline(out + lVar3 + 1,in + length * strategy,_y,length,bytewidth_00,filterType);
        _y = in + length * strategy;
      }
    }
    else {
      if ((LodePNGFilterStrategy)outindex != LFS_BRUTE_FORCE) {
        return 0x58;
      }
      _bestType_2 = 0;
      dummy._0_4_ = 0;
      memcpy(local_6f0,settings,0x30);
      local_6f0 = (undefined1  [4])0x1;
      zlibsettings.nicematch = 0;
      zlibsettings.lazymatching = 0;
      zlibsettings.custom_zlib =
           (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
      for (dummy._4_4_ = 0; dummy._4_4_ < 5; dummy._4_4_ = dummy._4_4_ + 1) {
        ucvector_init((ucvector *)&attempt_2[(ulong)dummy._4_4_ - 1].allocsize);
        ucvector_resize((ucvector *)&attempt_2[(ulong)dummy._4_4_ - 1].allocsize,length);
      }
      for (strategy = LFS_ZERO; strategy < h; strategy = strategy + LFS_MINSUM) {
        for (dummy._4_4_ = 0; dummy._4_4_ < 5; dummy._4_4_ = dummy._4_4_ + 1) {
          puVar1 = attempt_2[dummy._4_4_].data;
          filterScanline((uchar *)attempt_2[(ulong)dummy._4_4_ - 1].allocsize,in + strategy * length
                         ,_y,length,bytewidth_00,(uchar)dummy._4_4_);
          size[(ulong)dummy._4_4_ - 1] = 0;
          zlibsettings.custom_context = (void *)0x0;
          zlib_compress((uchar **)&zlibsettings.custom_context,size + ((ulong)dummy._4_4_ - 1),
                        (uchar *)attempt_2[(ulong)dummy._4_4_ - 1].allocsize,
                        (ulong)puVar1 & 0xffffffff,(LodePNGCompressSettings *)local_6f0);
          lodepng_free(zlibsettings.custom_context);
          if ((dummy._4_4_ == 0) || (size[(ulong)dummy._4_4_ - 1] < _bestType_2)) {
            dummy._0_4_ = dummy._4_4_;
            _bestType_2 = size[(ulong)dummy._4_4_ - 1];
          }
        }
        _y = in + strategy * length;
        out[(ulong)strategy * (length + 1)] = (uchar)(uint)dummy;
        for (error = 0; error < length; error = error + 1) {
          out[(ulong)strategy * (length + 1) + 1 + (ulong)error] =
               *(uchar *)(attempt_2[(ulong)(uint)dummy - 1].allocsize + (ulong)error);
        }
      }
      for (dummy._4_4_ = 0; dummy._4_4_ < 5; dummy._4_4_ = dummy._4_4_ + 1) {
        ucvector_cleanup(&attempt_2[(ulong)dummy._4_4_ - 1].allocsize);
      }
    }
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y < h; y++)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y < h; y++)
      {
        /*try the 5 filter types*/
        for(type = 0; type < 5; type++)
        {
          filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x < linebytes; x++) sum[type] += (unsigned char)(attempt[type].data[x]);
          }
          else
          {
            for(x = 0; x < linebytes; x++)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type].data[x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
      }
    }

    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    for(y = 0; y < h; y++)
    {
      /*try the 5 filter types*/
      for(type = 0; type < 5; type++)
      {
        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x < 256; x++) count[x] = 0;
        for(x = 0; x < linebytes; x++) count[attempt[type].data[x]]++;
        count[type]++; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x < 256; x++)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }

    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y < h; y++)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      ucvector_resize(&attempt[type], linebytes); /*todo: give error if resize failed*/
    }
    for(y = 0; y < h; y++) /*try the 5 filter types*/
    {
      for(type = 0; type < 5; type++)
      {
        unsigned testsize = attempt[type].size;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type].data, testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }
    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}